

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_format(lua_State *L)

{
  uint64_t uVar1;
  TValue *pTVar2;
  SBuf *sb_00;
  GCstr *pGVar3;
  SBuf *sb;
  int retry;
  lua_State *L_local;
  SBuf *sb_1;
  
  sb._4_4_ = 0;
  do {
    uVar1 = (L->glref).ptr64;
    sb_00 = (SBuf *)(uVar1 + 200);
    *(lua_State **)(uVar1 + 0xe0) = L;
    sb_00->w = *(char **)(uVar1 + 0xd8);
    sb._4_4_ = lj_strfmt_putarg(L,sb_00,1,-sb._4_4_);
  } while (0 < sb._4_4_);
  pTVar2 = L->top;
  pGVar3 = lj_str_new(L,*(char **)(uVar1 + 0xd8),
                      (ulong)(uint)((int)sb_00->w - (int)*(undefined8 *)(uVar1 + 0xd8)));
  pTVar2[-1].u64 = (ulong)pGVar3 | 0xfffd800000000000;
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(string_format)		LJLIB_REC(.)
{
  int retry = 0;
  SBuf *sb;
  do {
    sb = lj_buf_tmp_(L);
    retry = lj_strfmt_putarg(L, sb, 1, -retry);
  } while (retry > 0);
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}